

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderMD.cpp
# Opt level: O0

BYTE __thiscall EncoderMD::EmitModRM(EncoderMD *this,Instr *instr,Opnd *opnd,BYTE reg1)

{
  byte *pbVar1;
  BYTE *pBVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  RegNum RVar6;
  byte bVar7;
  byte bVar8;
  BYTE BVar9;
  undefined4 *puVar10;
  SymOpnd *pSVar11;
  StackSym *pSVar12;
  MemRefOpnd *this_00;
  size_t value;
  RegNum local_57;
  byte local_56;
  byte local_55;
  byte local_54;
  byte local_53;
  byte local_52;
  BYTE retval;
  BYTE mod;
  RegNum rmReg;
  BYTE byte;
  BYTE rexEncoding;
  BYTE baseRegEncode;
  BYTE regIndex;
  BYTE regBase;
  BYTE reg;
  RegOpnd *indexOpnd;
  RegOpnd *baseOpnd;
  RegOpnd *regOpnd;
  IndirOpnd *indirOpnd;
  int dispSize;
  BYTE reg1_local;
  Opnd *opnd_local;
  Instr *instr_local;
  EncoderMD *this_local;
  
  indirOpnd._0_4_ = -1;
  local_55 = 0;
  indirOpnd._7_1_ = reg1;
  _dispSize = opnd;
  opnd_local = (Opnd *)instr;
  instr_local = (Instr *)this;
  if ((reg1 & 7) != reg1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                       ,0x13c,"((reg1 & 7) == reg1)","Invalid reg1");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  indirOpnd._7_1_ = (indirOpnd._7_1_ & 7) << 3;
  OVar5 = IR::Opnd::GetKind(_dispSize);
  switch(OVar5) {
  case OpndKindSym:
    pSVar11 = IR::Opnd::AsSymOpnd(_dispSize);
    bVar4 = Sym::IsStackSym(pSVar11->m_sym);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                         ,0x154,"(opnd->AsSymOpnd()->m_sym->IsStackSym())",
                         "Should only see stackSym syms in encoder.");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    pSVar11 = IR::Opnd::AsSymOpnd(_dispSize);
    bVar8 = GetMod(this,pSVar11,(int *)&indirOpnd,&local_57);
    local_54 = GetRegEncode(this,local_57);
    local_56 = bVar8 | indirOpnd._7_1_ | local_54;
    pbVar1 = this->m_pc;
    this->m_pc = pbVar1 + 1;
    *pbVar1 = local_56;
    if (local_57 == RegRSP) {
      local_56 = (local_54 & 7) << 3 | local_54 & 7;
      pbVar1 = this->m_pc;
      this->m_pc = pbVar1 + 1;
      *pbVar1 = local_56;
    }
    else {
      pSVar11 = IR::Opnd::AsSymOpnd(_dispSize);
      pSVar12 = Sym::AsStackSym(pSVar11->m_sym);
      if (pSVar12->m_offset == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                           ,0x164,"(opnd->AsSymOpnd()->m_sym->AsStackSym()->m_offset)",
                           "Expected stackSym offset to be set.");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
    }
    break;
  case OpndKindReg:
    baseOpnd = IR::Opnd::AsRegOpnd(_dispSize);
    RVar6 = IR::RegOpnd::GetReg(baseOpnd);
    if (RVar6 == RegNOREG) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                         ,0x145,"(regOpnd->GetReg() != RegNOREG)",
                         "All regOpnd should have a valid reg set during encoder");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    retval = GetRegEncode(this,baseOpnd);
    EmitConst(this,(long)(int)(indirOpnd._7_1_ | 0xc0 | (uint)retval),1,false);
    RVar6 = IR::RegOpnd::GetReg(baseOpnd);
    bVar4 = IsExtendedRegister(this,RVar6);
    if (!bVar4) {
      return '\0';
    }
    return '\x01';
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                       ,0x1a1,"((0))","Unexpected operand kind");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
    break;
  case OpndKindIndir:
    regOpnd = (RegOpnd *)IR::Opnd::AsIndirOpnd(_dispSize);
    indexOpnd = IR::IndirOpnd::GetBaseOpnd((IndirOpnd *)regOpnd);
    _mod = IR::IndirOpnd::GetIndexOpnd((IndirOpnd *)regOpnd);
    if ((_mod != (RegOpnd *)0x0) && (RVar6 = IR::RegOpnd::GetReg(_mod), RVar6 == RegRSP)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                         ,0x16f,"(!indexOpnd || indexOpnd->GetReg() != RegRSP)",
                         "ESP cannot be the index of an indir.");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    if (indexOpnd == (RegOpnd *)0x0) {
      if (_mod == (RegOpnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                           ,0x172,"(indexOpnd != nullptr)","indexOpnd != nullptr");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      local_53 = GetRegEncode(this,_mod);
      indirOpnd._0_4_ = 4;
      pbVar1 = this->m_pc;
      this->m_pc = pbVar1 + 1;
      *pbVar1 = indirOpnd._7_1_ | 4;
      bVar7 = IR::IndirOpnd::GetScale((IndirOpnd *)regOpnd);
      pbVar1 = this->m_pc;
      this->m_pc = pbVar1 + 1;
      *pbVar1 = bVar7 << 6 | (local_53 & 7) << 3 | 5;
      bVar8 = GetRexByte(this,'\x02',&_mod->super_Opnd);
      local_55 = local_55 | bVar8;
    }
    else {
      local_52 = GetRegEncode(this,indexOpnd);
      if (_mod == (RegOpnd *)0x0) {
        RVar6 = IR::RegOpnd::GetReg(indexOpnd);
        if ((RVar6 == RegR12) || (RVar6 = IR::RegOpnd::GetReg(indexOpnd), RVar6 == RegRSP)) {
          bVar8 = GetMod(this,(IndirOpnd *)regOpnd,(int *)&indirOpnd);
          pbVar1 = this->m_pc;
          this->m_pc = pbVar1 + 1;
          *pbVar1 = bVar8 | indirOpnd._7_1_ | local_52;
          pbVar1 = this->m_pc;
          this->m_pc = pbVar1 + 1;
          *pbVar1 = (local_52 & 7) << 3 | local_52 & 7;
          bVar8 = GetRexByte(this,'\x01',&indexOpnd->super_Opnd);
          local_55 = local_55 | bVar8;
        }
        else {
          bVar8 = GetMod(this,(IndirOpnd *)regOpnd,(int *)&indirOpnd);
          pbVar1 = this->m_pc;
          this->m_pc = pbVar1 + 1;
          *pbVar1 = bVar8 | indirOpnd._7_1_ | local_52;
          bVar8 = GetRexByte(this,'\x01',&indexOpnd->super_Opnd);
          local_55 = local_55 | bVar8;
        }
      }
      else {
        local_53 = GetRegEncode(this,_mod);
        bVar8 = GetMod(this,(IndirOpnd *)regOpnd,(int *)&indirOpnd);
        pbVar1 = this->m_pc;
        this->m_pc = pbVar1 + 1;
        *pbVar1 = bVar8 | indirOpnd._7_1_ | 4;
        bVar7 = IR::IndirOpnd::GetScale((IndirOpnd *)regOpnd);
        pbVar1 = this->m_pc;
        this->m_pc = pbVar1 + 1;
        *pbVar1 = bVar7 << 6 | (local_53 & 7) << 3 | local_52 & 7;
        bVar8 = GetRexByte(this,'\x02',&_mod->super_Opnd);
        local_55 = local_55 | bVar8;
        bVar8 = GetRexByte(this,'\x01',&indexOpnd->super_Opnd);
        local_55 = local_55 | bVar8;
      }
    }
    break;
  case OpndKindMemRef:
    pbVar1 = this->m_pc;
    this->m_pc = pbVar1 + 1;
    *pbVar1 = indirOpnd._7_1_ | 4;
    pBVar2 = this->m_pc;
    this->m_pc = pBVar2 + 1;
    *pBVar2 = '%';
    this_00 = IR::Opnd::AsMemRefOpnd(_dispSize);
    value = IR::MemRefOpnd::GetMemLoc(this_00);
    bVar4 = Math::FitsInDWord(value);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                         ,0x19c,"(Math::FitsInDWord((size_t)opnd->AsMemRefOpnd()->GetMemLoc()))",
                         "Size overflow");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    indirOpnd._0_4_ = 4;
  }
  if ((int)indirOpnd == -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                       ,0x1a5,"(dispSize != -1)","Uninitialized dispSize");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  BVar9 = EmitImmed(this,_dispSize,(int)indirOpnd,0,false);
  if (BVar9 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                       ,0x1a9,"(retval == 0)","Not possible.");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  return local_55;
}

Assistant:

BYTE
EncoderMD::EmitModRM(IR::Instr * instr, IR::Opnd *opnd, BYTE reg1)
{
    int dispSize = -1; // Initialize to suppress C4701 false positive
    IR::IndirOpnd *indirOpnd;
    IR::RegOpnd *regOpnd;
    IR::RegOpnd *baseOpnd;
    IR::RegOpnd *indexOpnd;
    BYTE reg;
    BYTE regBase;
    BYTE regIndex;
    BYTE baseRegEncode;
    BYTE rexEncoding = 0;

    AssertMsg( (reg1 & 7) == reg1, "Invalid reg1");

    reg1 = (reg1 & 7) << 3;       // mask and put in reg field

    switch (opnd->GetKind())
    {
    case IR::OpndKindReg:
        regOpnd = opnd->AsRegOpnd();

        AssertMsg(regOpnd->GetReg() != RegNOREG, "All regOpnd should have a valid reg set during encoder");

        reg = this->GetRegEncode(regOpnd);
        this->EmitConst((Mod11 | reg1 | reg), 1);

        if (this->IsExtendedRegister(regOpnd->GetReg()))
        {
            return REXB;
        }
        else
        {
            return 0;
        }

    case IR::OpndKindSym:
        AssertMsg(opnd->AsSymOpnd()->m_sym->IsStackSym(), "Should only see stackSym syms in encoder.");

        BYTE byte;
        RegNum rmReg;
        BYTE mod;
        mod = this->GetMod(opnd->AsSymOpnd(), &dispSize, rmReg);
        baseRegEncode = this->GetRegEncode(rmReg);
        byte = (BYTE)(mod | reg1 | baseRegEncode);
        *(m_pc++) = byte;
        if (rmReg == RegRSP)
        {
            byte = (BYTE)(((baseRegEncode & 7) << 3) | (baseRegEncode & 7));
            *(m_pc++) = byte;
        }
        else
        {
            AssertMsg(opnd->AsSymOpnd()->m_sym->AsStackSym()->m_offset, "Expected stackSym offset to be set.");
        }
        break;

    case IR::OpndKindIndir:

        indirOpnd = opnd->AsIndirOpnd();

        baseOpnd = indirOpnd->GetBaseOpnd();
        indexOpnd = indirOpnd->GetIndexOpnd();

        AssertMsg(!indexOpnd || indexOpnd->GetReg() != RegRSP, "ESP cannot be the index of an indir.");
        if (baseOpnd == nullptr)
        {
            Assert(indexOpnd != nullptr);
            regIndex = this->GetRegEncode(indexOpnd);
            dispSize = 4;
            *(m_pc++) = ( Mod00 | reg1 | 0x4);
            *(m_pc++) = (((indirOpnd->GetScale() & 3) << 6) | ((regIndex & 7) << 3) | 0x5);

            rexEncoding |= this->GetRexByte(this->REXX, indexOpnd);
        }
        else
        {
            regBase = this->GetRegEncode(baseOpnd);

            if (indexOpnd != nullptr)
            {
                regIndex = this->GetRegEncode(indexOpnd);
                *(m_pc++) = (this->GetMod(indirOpnd, &dispSize) | reg1 | 0x4);
                *(m_pc++) = (((indirOpnd->GetScale() & 3) << 6) | ((regIndex & 7) << 3) | (regBase & 7));

                rexEncoding |= this->GetRexByte(this->REXX, indexOpnd);
                rexEncoding |= this->GetRexByte(this->REXB, baseOpnd);
            }
            else if (baseOpnd->GetReg() == RegR12 || baseOpnd->GetReg() == RegRSP)
            {
                //
                // Using RSP/R12 as base requires the SIB byte even where there is no index.
                //
                *(m_pc++) = (this->GetMod(indirOpnd, &dispSize) | reg1 | regBase);
                *(m_pc++) = (BYTE)(((regBase & 7) << 3) | (regBase & 7));

                rexEncoding |= this->GetRexByte(this->REXB, baseOpnd);
            }
            else
            {
                *(m_pc++) = (this->GetMod(indirOpnd, &dispSize) | reg1 | regBase);
                rexEncoding |= this->GetRexByte(this->REXB, baseOpnd);
            }
        }
        break;

    case IR::OpndKindMemRef:
        *(m_pc++)   = (char)(reg1 | 0x4);
        *(m_pc++)   = 0x25;       // SIB displacement
        AssertMsg(Math::FitsInDWord((size_t)opnd->AsMemRefOpnd()->GetMemLoc()), "Size overflow");
        dispSize    = 4;
        break;

    default:
        AssertMsg(UNREACHED, "Unexpected operand kind");
        break;
    }

    AssertMsg(dispSize != -1, "Uninitialized dispSize");

    BYTE retval = this->EmitImmed(opnd, dispSize, 0);

    AssertMsg(retval == 0, "Not possible.");
    return rexEncoding;
}